

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateEpsRel_Test::TestBody
          (OsqpTest_GetAndUpdateEpsRel_Test *this)

{
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 *paVar1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  bool bVar3;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  OsqpSolver solver;
  AssertionResult gtest_ar;
  OsqpSettings settings;
  AssertHelper local_1b0;
  _Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false> local_1a8;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 local_1a0;
  anon_union_8_1_1246618d_for_StatusOrData<double>_1 local_198;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 local_190;
  AssertHelper local_188;
  undefined1 local_180 [8];
  undefined1 local_178 [8];
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  Scalar *local_158;
  CompressedStorage<double,_long_long> local_150;
  void *local_130;
  StorageIndex *local_108;
  Scalar *local_100;
  CompressedStorage<double,_long_long> local_f8;
  void *local_d8;
  void *local_c8;
  OsqpSettings local_b8;
  
  OsqpSettings::OsqpSettings(&local_b8);
  local_b8.eps_rel = (double)&DAT_3f689374bc6a7efa;
  local_180 = (undefined1  [8])0x0;
  GetToyProblem();
  OsqpSolver::Init((OsqpSolver *)&local_1a8,(OsqpInstance *)local_180,(OsqpSettings *)local_178);
  local_198.status_.rep_._0_1_ = (StatusRep *)local_1a8._M_head_impl == (StatusRep *)0x1;
  local_190.data_ = 0.0;
  if (((ulong)local_1a8._M_head_impl & 1) == 0) {
    absl::status_internal::StatusRep::Unref((StatusRep *)local_1a8._M_head_impl);
  }
  free(local_c8);
  free(local_d8);
  free(local_108);
  free(local_100);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_f8);
  free(local_130);
  free((void *)local_168._8_8_);
  free(local_158);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_150);
  if (local_198.status_.rep_._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_178,(internal *)&local_198.status_,
               (AssertionResult *)"solver.Init(GetToyProblem(), settings).ok()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x290,(char *)CONCAT71(local_178._1_7_,local_178[0]));
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1a8);
LAB_0012709d:
    paVar1 = &local_190;
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if ((undefined1 *)CONCAT71(local_178._1_7_,local_178[0]) != local_178 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_178._1_7_,local_178[0]),
                      local_168._M_allocated_capacity + 1);
    }
    if ((StatusRep *)local_1a8._M_head_impl != (StatusRep *)0x0) {
      (**(code **)(*(long *)&((local_1a8._M_head_impl)->super_OSQPWorkspace).data + 8))();
    }
    local_170 = local_190;
    if (local_190 == (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) goto LAB_0012721c;
  }
  else {
    if (local_190 != (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    }
    local_198.status_.rep_._0_4_ = OsqpSolver::Solve((OsqpSolver *)local_180);
    local_1a8._M_head_impl = (OSQPWorkspaceHelper *)((ulong)local_1a8._M_head_impl._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)local_178,"solver.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&local_198,(OsqpExitCode *)&local_1a8);
    if (local_178[0] != (internal)0x0) {
      if (local_170 != (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_178 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170)
        ;
      }
      OsqpSolver::GetEpsRel((OsqpSolver *)&local_198.status_);
      bVar3 = CONCAT44(local_198.status_.rep_._4_4_,local_198.status_.rep_._0_4_) == 1;
      local_1a8._M_head_impl._0_1_ = bVar3;
      local_1a0.data_ = 0.0;
      if (bVar3) {
        if (CONCAT44(local_198.status_.rep_._4_4_,local_198.status_.rep_._0_4_) != 1) {
          absl::internal_statusor::Helper::Crash(&local_198.status_);
        }
        local_1a8._M_head_impl = (OSQPWorkspaceHelper *)&DAT_3f689374bc6a7efa;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)local_178,"*eps_rel","3.0e-3",&local_190.data_,(double *)&local_1a8);
        if (local_178[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a8);
          if (local_170 == (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_170;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x296,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1a8);
          testing::internal::AssertHelper::~AssertHelper(&local_1b0);
          if ((StatusRep *)local_1a8._M_head_impl != (StatusRep *)0x0) {
            (**(code **)(*(long *)&((local_1a8._M_head_impl)->super_OSQPWorkspace).data + 8))();
          }
        }
        if (local_170 != (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_178 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170);
        }
        absl::internal_statusor::StatusOrData<double>::~StatusOrData
                  ((StatusOrData<double> *)&local_198.status_);
        OsqpSolver::UpdateEpsRel((OsqpSolver *)local_178,0.0004);
        local_198.status_.rep_._0_1_ =
             (StatusRep *)CONCAT71(local_178._1_7_,local_178[0]) == (StatusRep *)0x1;
        local_190.data_ = 0.0;
        if (((byte)local_178[0] & 1) == 0) {
          absl::status_internal::StatusRep::Unref
                    ((StatusRep *)CONCAT71(local_178._1_7_,local_178[0]));
        }
        if (local_198.status_.rep_._0_1_ == '\0') {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_178,(internal *)&local_198.status_,
                     (AssertionResult *)"solver.UpdateEpsRel(4.0e-4).ok()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x299,(char *)CONCAT71(local_178._1_7_,local_178[0]));
          testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1a8);
          goto LAB_0012709d;
        }
        if (local_190 != (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_190);
        }
        OsqpSolver::GetEpsRel((OsqpSolver *)&local_198.status_);
        bVar3 = CONCAT44(local_198.status_.rep_._4_4_,local_198.status_.rep_._0_4_) == 1;
        local_1a8._M_head_impl._0_1_ = bVar3;
        local_1a0.data_ = 0.0;
        if (!bVar3) {
          testing::Message::Message((Message *)&local_1b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_178,(internal *)&local_1a8,(AssertionResult *)"eps_rel.ok()",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x29c,(char *)CONCAT71(local_178._1_7_,local_178[0]));
          testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1b0);
          goto LAB_0012716a;
        }
        if (CONCAT44(local_198.status_.rep_._4_4_,local_198.status_.rep_._0_4_) != 1) {
          absl::internal_statusor::Helper::Crash(&local_198.status_);
        }
        local_1a8._M_head_impl = (OSQPWorkspaceHelper *)&DAT_3f3a36e2eb1c432d;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)local_178,"*eps_rel","4.0e-4",&local_190.data_,(double *)&local_1a8);
        if (local_178[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1a8);
          if (local_170 == (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_170;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,0x29d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1a8);
          testing::internal::AssertHelper::~AssertHelper(&local_1b0);
          if ((StatusRep *)local_1a8._M_head_impl != (StatusRep *)0x0) {
            (**(code **)(*(long *)&((local_1a8._M_head_impl)->super_OSQPWorkspace).data + 8))();
          }
        }
        if (local_170 != (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
          paVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 *)(local_178 + 8);
          goto LAB_001271ac;
        }
      }
      else {
        testing::Message::Message((Message *)&local_1b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_178,(internal *)&local_1a8,(AssertionResult *)"eps_rel.ok()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x295,(char *)CONCAT71(local_178._1_7_,local_178[0]));
        testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1b0);
LAB_0012716a:
        paVar1 = &local_1a0;
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        if ((undefined1 *)CONCAT71(local_178._1_7_,local_178[0]) != local_178 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_178._1_7_,local_178[0]),
                          local_168._M_allocated_capacity + 1);
        }
        if (local_1b0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_1b0.data_ + 8))();
        }
        local_170 = local_1a0;
        if (local_1a0 != (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
LAB_001271ac:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)paVar1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170);
        }
      }
      absl::internal_statusor::StatusOrData<double>::~StatusOrData
                ((StatusOrData<double> *)&local_198.status_);
      goto LAB_0012721c;
    }
    testing::Message::Message((Message *)&local_198.status_);
    if (local_170 == (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_170;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x291,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_1a8,(Message *)&local_198.status_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if ((long *)CONCAT44(local_198.status_.rep_._4_4_,local_198.status_.rep_._0_4_) != (long *)0x0)
    {
      (**(code **)(*(long *)CONCAT44(local_198.status_.rep_._4_4_,local_198.status_.rep_._0_4_) + 8)
      )();
    }
    if (local_170 == (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3)0x0) goto LAB_0012721c;
    paVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 *)(local_178 + 8);
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)paVar1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
LAB_0012721c:
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)local_180);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateEpsRel) {
  OsqpSettings settings;
  settings.eps_rel = 3.0e-3;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto eps_rel = solver.GetEpsRel();
    ASSERT_TRUE(eps_rel.ok());
    EXPECT_EQ(*eps_rel, 3.0e-3);
  }

  ASSERT_TRUE(solver.UpdateEpsRel(4.0e-4).ok());
  {
    const auto eps_rel = solver.GetEpsRel();
    ASSERT_TRUE(eps_rel.ok());
    EXPECT_EQ(*eps_rel, 4.0e-4);
  }
}